

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O0

wchar_t get_monster_brand_multiplier(monster *mon,brand_conflict *b,_Bool is_o_combat)

{
  _Bool _Var1;
  wchar_t local_24;
  wchar_t local_20;
  wchar_t mult;
  _Bool is_o_combat_local;
  brand_conflict *b_local;
  monster *mon_local;
  
  if (is_o_combat) {
    local_24 = b->o_multiplier;
  }
  else {
    local_24 = b->multiplier;
  }
  local_20 = local_24;
  if ((b->vuln_flag != 0) &&
     (_Var1 = flag_has_dbg(mon->race->flags,0xb,b->vuln_flag,"mon->race->flags","b->vuln_flag"),
     _Var1)) {
    if (is_o_combat) {
      local_20 = (local_24 + L'\xfffffff6') * 2 + L'\n';
    }
    else {
      local_20 = local_24 << 1;
    }
  }
  return local_20;
}

Assistant:

int get_monster_brand_multiplier(const struct monster *mon,
		const struct brand *b, bool is_o_combat)
{
	int mult = (is_o_combat) ? b->o_multiplier : b->multiplier;

	if (b->vuln_flag && rf_has(mon->race->flags, b->vuln_flag)) {
		/*
		 * If especially vulnerable, apply a factor of two to the
		 * extra damage from the brand.
		 */
		if (is_o_combat) {
			mult = 2 * (mult - 10) + 10;
		} else {
			mult *= 2;
		}
	}

	return mult;
}